

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitops.hpp
# Opt level: O0

uint lcp_bitwise<unsigned_long>(unsigned_long x,unsigned_long y,uint k,uint bits_per_char)

{
  uint uVar1;
  uint lcp;
  uint kmer_leading_zeros;
  uint lz;
  unsigned_long z;
  uint bits_per_char_local;
  uint k_local;
  unsigned_long y_local;
  unsigned_long x_local;
  
  x_local._4_4_ = k;
  if (x != y) {
    uVar1 = leading_zeros<unsigned_long>(x ^ y);
    x_local._4_4_ = (uVar1 - (0x40 - k * bits_per_char)) / bits_per_char;
  }
  return x_local._4_4_;
}

Assistant:

unsigned int lcp_bitwise(T x, T y, unsigned int k, unsigned int bits_per_char) {
    if (x == y)
        return k;
    // XOR the two values and then find the MSB that isn't zero (since
    // the k-mer strings start (have first character) at MSB)
    T z = x ^ y;
    // get leading zeros (TODO: in bitops implement faster version for 32bit)
    unsigned int lz = leading_zeros(z);

    // get leading zeros in the k-mer representation
    unsigned int kmer_leading_zeros = lz - (sizeof(T)*8 - k*bits_per_char);
    unsigned int lcp = kmer_leading_zeros / bits_per_char;
    return lcp;
}